

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O0

void __thiscall crnlib::symbol_codec::clear(symbol_codec *this)

{
  symbol_codec *this_local;
  
  this->m_pDecode_buf = (uint8 *)0x0;
  this->m_pDecode_buf_next = (uint8 *)0x0;
  this->m_pDecode_buf_end = (uint8 *)0x0;
  this->m_decode_buf_size = 0;
  this->m_bit_buf = 0;
  this->m_bit_count = 0;
  this->m_total_model_updates = 0;
  this->m_mode = cNull;
  this->m_simulate_encoding = false;
  this->m_total_bits_written = 0;
  this->m_arith_base = 0;
  this->m_arith_value = 0;
  this->m_arith_length = 0;
  this->m_arith_total_bits = 0;
  vector<unsigned_char>::clear(&this->m_output_buf);
  vector<unsigned_char>::clear(&this->m_arith_output_buf);
  vector<crnlib::symbol_codec::output_symbol>::clear(&this->m_output_syms);
  return;
}

Assistant:

void symbol_codec::clear()
    {
        m_pDecode_buf = nullptr;
        m_pDecode_buf_next = nullptr;
        m_pDecode_buf_end = nullptr;
        m_decode_buf_size = 0;

        m_bit_buf = 0;
        m_bit_count = 0;
        m_total_model_updates = 0;
        m_mode = cNull;
        m_simulate_encoding = false;
        m_total_bits_written = 0;

        m_arith_base = 0;
        m_arith_value = 0;
        m_arith_length = 0;
        m_arith_total_bits = 0;

        m_output_buf.clear();
        m_arith_output_buf.clear();
        m_output_syms.clear();
    }